

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test::TestBody
          (ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test *this)

{
  undefined1 *puVar1;
  Script *this_00;
  Script *this_01;
  undefined8 uVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  long lVar8;
  char *pcVar9;
  Amount *expected_predicate_value;
  Script *this_02;
  initializer_list<cfd::UtxoData> __l;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l_00;
  AssertionResult gtest_ar_;
  undefined1 local_33f0 [16];
  AssertHelper local_33e0 [4];
  uint32_t minimum_fee;
  undefined4 uStack_33bc;
  undefined1 local_33b0 [23];
  ElementsTransactionApi api;
  undefined1 local_3398 [32];
  Pubkey local_3378;
  undefined8 local_3360;
  undefined1 local_3358;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  long local_3348;
  Amount tx_fee;
  Amount utxo_fee;
  Amount fee;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SigHashType local_32bc [12];
  SigHashType local_32b0 [12];
  SigHashType local_32a4 [12];
  ElementsAddressFactory factory;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  local_3288 [24];
  ConfidentialTransactionContext txc;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_31a8;
  uchar local_3198 [16];
  void *local_3188;
  void *local_3170;
  void *local_3158;
  code *local_3140 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_30c8;
  Script local_30b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3070 [19];
  UtxoData local_2cc8 [8];
  Script local_2cc0;
  uint32_t local_2c88;
  UtxoData local_2c80 [1192];
  UtxoData local_27d8 [72];
  undefined8 local_2790;
  Script local_2788;
  uint32_t local_2750;
  UtxoData local_2748 [1264];
  undefined8 local_2258;
  Script local_2250;
  uint32_t local_2218;
  ElementsUtxoAndOption eutxo1;
  UtxoData utxo2;
  Txid local_1ca8;
  uint local_1c88;
  Script local_1c80 [2];
  Address local_1c10 [376];
  undefined1 local_1a98 [8];
  char *local_1a90;
  undefined1 local_1a78 [504];
  BlindFactor local_1880;
  BlindFactor local_1860;
  ConfidentialValue local_1840 [2];
  UtxoData utxo1;
  Txid local_17b8;
  uint local_1798;
  Script local_1790 [2];
  Address local_1720 [376];
  undefined1 local_15a8 [8];
  char *local_15a0;
  AssertionResult local_1588;
  undefined4 local_1578;
  undefined8 local_1570;
  ConfidentialAssetId local_1568 [15];
  UtxoData utxo3;
  Txid local_12c8;
  uint local_12a8;
  Script local_12a0 [2];
  Address local_1230 [376];
  undefined1 local_10b8 [8];
  char *local_10b0;
  AssertionResult local_1098;
  undefined4 local_1088;
  undefined8 local_1080;
  ConfidentialAssetId local_1078 [15];
  ElementsConfidentialAddress asset_address;
  ElementsConfidentialAddress address;
  ElementsUtxoAndOption eutxo3;
  ElementsUtxoAndOption eutxo2;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kElementsRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  _utxo1 = 0;
  local_1570 = 0;
  puVar1 = &eutxo1.field_0x10;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",""
            );
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&eutxo1);
  cfd::core::Txid::operator=(&local_17b8,(Txid *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__Txid_002e1e60;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  local_1798 = 0;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&eutxo1);
  cfd::core::Script::operator=(local_1790,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress((string *)&gtest_ar);
  cfd::core::Address::operator=(local_1720,(Address *)&gtest_ar);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_3070);
  cfd::core::Script::~Script(&local_30b0);
  local_3140[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_30c8)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_3140);
  if (local_3158 != (void *)0x0) {
    operator_delete(local_3158);
  }
  if (local_3170 != (void *)0x0) {
    operator_delete(local_3170);
  }
  if (local_3188 != (void *)0x0) {
    operator_delete(local_3188);
  }
  if ((uchar *)local_31a8._M_allocated_capacity != local_3198) {
    operator_delete((void *)local_31a8._M_allocated_capacity);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  std::__cxx11::string::_M_replace((ulong)local_15a8,0,local_15a0,0x28cd3c);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,100000000000000);
  local_1588.message_.ptr_._0_1_ = gtest_ar.message_.ptr_._0_1_;
  local_1588.success_ = gtest_ar.success_;
  local_1588._1_7_ = gtest_ar._1_7_;
  local_1578 = 2;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",""
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&eutxo1);
  cfd::core::ConfidentialAssetId::operator=(local_1568,(ConfidentialAssetId *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_002e2170;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  cfd::UtxoData::UtxoData(&utxo2);
  _utxo2 = 0;
  local_1a78._24_8_ = (pointer)0x0;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",""
            );
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&eutxo1);
  cfd::core::Txid::operator=(&local_1ca8,(Txid *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__Txid_002e1e60;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  local_1c88 = 0;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&eutxo1);
  cfd::core::Script::operator=(local_1c80,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE","");
  cfd::AddressFactory::GetAddress((string *)&gtest_ar);
  cfd::core::Address::operator=(local_1c10,(Address *)&gtest_ar);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_3070);
  cfd::core::Script::~Script(&local_30b0);
  local_3140[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_30c8)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_3140);
  if (local_3158 != (void *)0x0) {
    operator_delete(local_3158);
  }
  if (local_3170 != (void *)0x0) {
    operator_delete(local_3170);
  }
  if (local_3188 != (void *)0x0) {
    operator_delete(local_3188);
  }
  if ((uchar *)local_31a8._M_allocated_capacity != local_3198) {
    operator_delete((void *)local_31a8._M_allocated_capacity);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  std::__cxx11::string::_M_replace((ulong)local_1a98,0,local_1a90,0x2521e7);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,18000000000000);
  local_1a78[8] = gtest_ar.message_.ptr_._0_1_;
  local_1a78._0_8_ = gtest_ar._0_8_;
  local_1a78._16_4_ = 6;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",""
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&eutxo1);
  cfd::core::ConfidentialAssetId::operator=
            ((ConfidentialAssetId *)(local_1a78 + 0x20),(ConfidentialAssetId *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_002e2170;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e",""
            );
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&gtest_ar,(string *)&eutxo1);
  cfd::core::BlindFactor::operator=(&local_1880,(BlindFactor *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__BlindFactor_002e1f10;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",""
            );
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&gtest_ar,(string *)&eutxo1);
  cfd::core::BlindFactor::operator=(&local_1860,(BlindFactor *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__BlindFactor_002e1f10;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa",
             "");
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&gtest_ar,(string *)&eutxo1);
  cfd::core::ConfidentialValue::operator=(local_1840,(ConfidentialValue *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__ConfidentialValue_002e2250;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  cfd::UtxoData::UtxoData(&utxo3);
  _utxo3 = 0;
  local_1080 = 0;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",""
            );
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&eutxo1);
  cfd::core::Txid::operator=(&local_12c8,(Txid *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__Txid_002e1e60;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  local_12a8 = 1;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&eutxo1);
  cfd::core::Script::operator=(local_12a0,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress((string *)&gtest_ar);
  cfd::core::Address::operator=(local_1230,(Address *)&gtest_ar);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_3070);
  cfd::core::Script::~Script(&local_30b0);
  local_3140[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_30c8)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_3140);
  if (local_3158 != (void *)0x0) {
    operator_delete(local_3158);
  }
  if (local_3170 != (void *)0x0) {
    operator_delete(local_3170);
  }
  if (local_3188 != (void *)0x0) {
    operator_delete(local_3188);
  }
  if ((uchar *)local_31a8._M_allocated_capacity != local_3198) {
    operator_delete((void *)local_31a8._M_allocated_capacity);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  std::__cxx11::string::_M_replace((ulong)local_10b8,0,local_10b0,0x28cd3b);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,100000000000000);
  local_1098.message_.ptr_._0_1_ = gtest_ar.message_.ptr_._0_1_;
  local_1098.success_ = gtest_ar.success_;
  local_1098._1_7_ = gtest_ar._1_7_;
  local_1088 = 4;
  eutxo1._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&eutxo1,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",""
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&eutxo1);
  cfd::core::ConfidentialAssetId::operator=(local_1078,(ConfidentialAssetId *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_002e2170;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)eutxo1._0_8_ != puVar1) {
    operator_delete((void *)eutxo1._0_8_);
  }
  gtest_ar._0_8_ = &local_31a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&address,(string *)&gtest_ar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_31a8) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar._0_8_ = &local_31a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&asset_address,(string *)&gtest_ar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_31a8) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  cfd::core::Amount::Amount(&fee,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::AddInput((UtxoData *)&txc);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&eutxo1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x160,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&eutxo1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&eutxo1);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_1ca8,local_1c88);
  cfd::ConfidentialTransactionContext::AddTxIn((OutPoint *)&txc);
  gtest_ar._0_8_ = &PTR__Txid_002e1e60;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_12c8,local_12a8);
  cfd::ConfidentialTransactionContext::AddTxIn((OutPoint *)&txc);
  gtest_ar._0_8_ = &PTR__Txid_002e1e60;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  eutxo1._0_8_ = cfd::core::operator+((Amount *)&local_1588,(Amount *)&local_1098);
  eutxo1._8_1_ = extraout_DL;
  gtest_ar._0_8_ = cfd::core::operator-((Amount *)&eutxo1,&fee);
  gtest_ar.message_.ptr_._0_1_ = extraout_DL_00;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)&txc,(Amount *)&address,(ConfidentialAssetId *)&gtest_ar
             ,SUB81(local_1568,0));
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)&txc,(Amount *)&gtest_ar,(ConfidentialAssetId *)local_1a78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_3070);
  cfd::core::Script::~Script(&local_30b0);
  local_3140[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_30c8)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_3140);
  if (local_3158 != (void *)0x0) {
    operator_delete(local_3158);
  }
  if (local_3170 != (void *)0x0) {
    operator_delete(local_3170);
  }
  if (local_3188 != (void *)0x0) {
    operator_delete(local_3188);
  }
  if ((uchar *)local_31a8._M_allocated_capacity != local_3198) {
    operator_delete((void *)local_31a8._M_allocated_capacity);
  }
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)&txc,(ConfidentialAssetId *)&fee);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  cfd::UtxoData::UtxoData(local_2cc8,&utxo2);
  cfd::UtxoData::UtxoData(local_27d8,&utxo3);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&eutxo1);
  lVar8 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar8));
    lVar8 = lVar8 + -0x4f0;
  } while (lVar8 != -0x4f0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)&txc);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&eutxo1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x168,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&eutxo1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&eutxo1);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::UtxoData::UtxoData(&eutxo1.utxo);
  eutxo1.is_issuance = false;
  eutxo1.is_blind_issuance = false;
  eutxo1.is_pegin = false;
  eutxo1.pegin_btc_tx_size = 0;
  cfd::core::Script::Script(&eutxo1.claim_script);
  eutxo1.pegin_txoutproof_size = 0;
  cfd::UtxoData::UtxoData(&eutxo2.utxo);
  this_00 = &eutxo2.claim_script;
  eutxo2.is_issuance = false;
  eutxo2.is_blind_issuance = false;
  eutxo2.is_pegin = false;
  eutxo2.pegin_btc_tx_size = 0;
  cfd::core::Script::Script(this_00);
  eutxo2.pegin_txoutproof_size = 0;
  cfd::UtxoData::UtxoData(&eutxo3.utxo);
  this_01 = &eutxo3.claim_script;
  eutxo3.is_issuance = false;
  eutxo3.is_blind_issuance = false;
  eutxo3.is_pegin = false;
  eutxo3.pegin_btc_tx_size = 0;
  cfd::core::Script::Script(this_01);
  eutxo3.pegin_txoutproof_size = 0;
  cfd::UtxoData::operator=(&eutxo1.utxo,&utxo1);
  cfd::UtxoData::operator=(&eutxo2.utxo,&utxo2);
  cfd::UtxoData::operator=(&eutxo3.utxo,&utxo3);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&eutxo1.utxo);
  local_2cc8[2] = eutxo1.is_pegin;
  local_2cc8[0] = eutxo1.is_issuance;
  local_2cc8[1] = eutxo1.is_blind_issuance;
  local_2cc8[3] = eutxo1._1267_1_;
  local_2cc8._4_4_ = eutxo1.pegin_btc_tx_size;
  cfd::core::Script::Script(&local_2cc0,&eutxo1.claim_script);
  local_2c88 = eutxo1.pegin_txoutproof_size;
  cfd::UtxoData::UtxoData(local_2c80,&eutxo2.utxo);
  local_2790 = CONCAT44(eutxo2.pegin_btc_tx_size,
                        CONCAT13(eutxo2._1267_1_,CONCAT12(eutxo2.is_pegin,eutxo2._1264_2_)));
  cfd::core::Script::Script(&local_2788,this_00);
  local_2750 = eutxo2.pegin_txoutproof_size;
  cfd::UtxoData::UtxoData(local_2748,&eutxo3.utxo);
  local_2258 = CONCAT44(eutxo3.pegin_btc_tx_size,
                        CONCAT13(eutxo3._1267_1_,CONCAT12(eutxo3.is_pegin,eutxo3._1264_2_)));
  cfd::core::Script::Script(&local_2250,this_01);
  local_2218 = eutxo3.pegin_txoutproof_size;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&gtest_ar;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector(&utxos_and_options,__l_00,(allocator_type *)&gtest_ar_);
  lVar8 = -0xfa8;
  this_02 = &local_2250;
  do {
    cfd::core::Script::~Script(this_02);
    cfd::UtxoData::~UtxoData
              ((UtxoData *)
               &this_02[-0x17].script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish);
    this_02 = (Script *)&this_02[-0x18].script_data_;
    lVar8 = lVar8 + 0x538;
  } while (lVar8 != 0);
  cfd::core::Amount::Amount((Amount *)&local_3360);
  cfd::core::Amount::Amount(&utxo_fee);
  cfd::core::Amount::Amount(&tx_fee);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  expected_predicate_value = &utxo_fee;
  local_3360 = cfd::api::ElementsTransactionApi::EstimateFee
                         ((string *)&api,(vector *)&gtest_ar,
                          (ConfidentialAssetId *)&utxos_and_options,(Amount *)local_1568,&tx_fee,
                          SUB81(expected_predicate_value,0),0.1,1,0,(uint *)0x24);
  local_3358 = extraout_DL_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_31a8) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue();
  local_33e0[0].data_._0_4_ = 0x100;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"calc_fee.GetSatoshiValue()","256",(long *)&gtest_ar_,
             (int *)local_33e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_33e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17d,pcVar9);
    testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(local_33e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue();
  local_33e0[0].data_._0_4_ = 0xe1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"tx_fee.GetSatoshiValue()","225",(long *)&gtest_ar_,
             (int *)local_33e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_33e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17e,pcVar9);
    testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(local_33e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue();
  local_33e0[0].data_._0_4_ = 0x20;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"utxo_fee.GetSatoshiValue()","32",(long *)&gtest_ar_,
             (int *)local_33e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_33e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17f,pcVar9);
    testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(local_33e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&asset_address);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      expected_predicate_value = (Amount *)0x0;
      cfd::ConfidentialTransactionContext::Blind((vector *)&txc,(long)&ct_addrs,1,0,(vector *)0x24);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x183,
               "Expected: txc.Blind(&ct_addrs, 1, 0, 36) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  gtest_ar_._0_8_ = (local_3348 - _txouts >> 3) * -0x1084210842108421;
  local_33e0[0].data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"txouts.size()","3",(unsigned_long *)&gtest_ar_,(int *)local_33e0
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_33e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x185,pcVar9);
    testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(local_33e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_3348 - _txouts == 0x2e8) {
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar,(ConfidentialValue *)(_txouts + 0x78));
    bVar3 = (bool)cfd::core::ConfidentialValue::HasBlinding();
    gtest_ar_.success_ = bVar3;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar._0_8_ = &PTR__ConfidentialValue_002e2250;
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(gtest_ar.message_.ptr_);
    }
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)local_33e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&minimum_fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x187,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&minimum_fee,(Message *)local_33e0)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minimum_fee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_31a8) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (local_33e0[0].data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_33e0[0].data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_33e0[0].data_ + 8))();
        }
        local_33e0[0].data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar,(ConfidentialValue *)(_txouts + 0x170));
    bVar3 = (bool)cfd::core::ConfidentialValue::HasBlinding();
    gtest_ar_.success_ = bVar3;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar._0_8_ = &PTR__ConfidentialValue_002e2250;
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(gtest_ar.message_.ptr_);
    }
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)local_33e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&minimum_fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x188,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&minimum_fee,(Message *)local_33e0)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minimum_fee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_31a8) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (local_33e0[0].data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_33e0[0].data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_33e0[0].data_ + 8))();
        }
        local_33e0[0].data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar,(ConfidentialValue *)(_txouts + 0x268));
    uVar4 = cfd::core::ConfidentialValue::HasBlinding();
    gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,uVar4) ^ 1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar._0_8_ = &PTR__ConfidentialValue_002e2250;
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(gtest_ar.message_.ptr_);
    }
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)local_33e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&minimum_fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x189,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&minimum_fee,(Message *)local_33e0)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minimum_fee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_31a8) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (local_33e0[0].data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_33e0[0].data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_33e0[0].data_ + 8))();
        }
        local_33e0[0].data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::core::ByteData::ByteData((ByteData *)local_3398);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_17b8,local_1798);
      gtest_ar_._0_8_ = local_33f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar_,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_3378,(string *)&gtest_ar_);
      _minimum_fee = (AssertHelperData *)local_33b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&minimum_fee,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((string *)local_33e0,(NetType)&minimum_fee,true);
      cfd::core::SigHashType::SigHashType(local_32a4);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,&gtest_ar,&local_3378,local_33e0,local_32a4,1);
      if (local_33e0[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_33e0[0].data_);
      }
      if (_minimum_fee != (AssertHelperData *)local_33b0) {
        operator_delete(_minimum_fee);
      }
      if (local_3378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3378.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)gtest_ar_._0_8_ != local_33f0) {
        operator_delete((void *)gtest_ar_._0_8_);
      }
      gtest_ar._0_8_ = &PTR__Txid_002e1e60;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x191,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_17b8,local_1798);
      cfd::ConfidentialTransactionContext::Verify((OutPoint *)&txc);
      gtest_ar._0_8_ = &PTR__Txid_002e1e60;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x192,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::ConfidentialTransactionContext::Finalize();
    uVar2 = local_3398._0_8_;
    local_3398._0_8_ = gtest_ar._0_8_;
    local_3398._8_8_ = gtest_ar.message_.ptr_;
    local_3398._16_8_ = local_31a8._M_allocated_capacity;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_31a8._M_allocated_capacity = 0;
    if ((pointer)uVar2 != (pointer)0x0) {
      operator_delete((void *)uVar2);
    }
    if (gtest_ar._0_8_ != 0) {
      operator_delete((void *)gtest_ar._0_8_);
    }
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x194,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  if (gtest_ar._0_8_ != 0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_1ca8,local_1c88);
      gtest_ar_._0_8_ = local_33f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar_,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_3378,(string *)&gtest_ar_);
      _minimum_fee = (AssertHelperData *)local_33b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&minimum_fee,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif((string *)local_33e0,(NetType)&minimum_fee,true);
      cfd::core::SigHashType::SigHashType(local_32b0);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,&gtest_ar,&local_3378,local_33e0,local_32b0,1);
      if (local_33e0[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_33e0[0].data_);
      }
      if (_minimum_fee != (AssertHelperData *)local_33b0) {
        operator_delete(_minimum_fee);
      }
      if (local_3378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3378.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)gtest_ar_._0_8_ != local_33f0) {
        operator_delete((void *)gtest_ar_._0_8_);
      }
      gtest_ar._0_8_ = &PTR__Txid_002e1e60;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x199,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_1ca8,local_1c88);
      cfd::ConfidentialTransactionContext::Verify((OutPoint *)&txc);
      gtest_ar._0_8_ = &PTR__Txid_002e1e60;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x19a,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::ConfidentialTransactionContext::Finalize();
    uVar2 = local_3398._0_8_;
    local_3398._0_8_ = gtest_ar._0_8_;
    local_3398._8_8_ = gtest_ar.message_.ptr_;
    local_3398._16_8_ = local_31a8._M_allocated_capacity;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_31a8._M_allocated_capacity = 0;
    if ((pointer)uVar2 != (pointer)0x0) {
      operator_delete((void *)uVar2);
    }
    if (gtest_ar._0_8_ != 0) {
      operator_delete((void *)gtest_ar._0_8_);
    }
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x19c,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  if (gtest_ar._0_8_ != 0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_12c8,local_12a8);
      gtest_ar_._0_8_ = local_33f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar_,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_3378,(string *)&gtest_ar_);
      _minimum_fee = (AssertHelperData *)local_33b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&minimum_fee,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((string *)local_33e0,(NetType)&minimum_fee,true);
      cfd::core::SigHashType::SigHashType(local_32bc);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,&gtest_ar,&local_3378,local_33e0,local_32bc,1);
      if (local_33e0[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_33e0[0].data_);
      }
      if (_minimum_fee != (AssertHelperData *)local_33b0) {
        operator_delete(_minimum_fee);
      }
      if (local_3378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3378.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)gtest_ar_._0_8_ != local_33f0) {
        operator_delete((void *)gtest_ar_._0_8_);
      }
      gtest_ar._0_8_ = &PTR__Txid_002e1e60;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a1,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&local_12c8,local_12a8);
      cfd::ConfidentialTransactionContext::Verify((OutPoint *)&txc);
      gtest_ar._0_8_ = &PTR__Txid_002e1e60;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a2,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::Finalize();
      uVar2 = local_3398._0_8_;
      local_3398._0_8_ = gtest_ar._0_8_;
      local_3398._8_8_ = gtest_ar.message_.ptr_;
      local_3398._16_8_ = local_31a8._M_allocated_capacity;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_31a8._M_allocated_capacity = 0;
      if ((pointer)uVar2 != (pointer)0x0) {
        operator_delete((void *)uVar2);
      }
      if (gtest_ar._0_8_ != 0) {
        operator_delete((void *)gtest_ar._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a4,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  lVar8 = cfd::core::ByteData::GetDataSize();
  if ((((lVar8 != 0x2155) && (lVar8 = cfd::core::ByteData::GetDataSize(), lVar8 != 0x2156)) &&
      (lVar8 = cfd::core::ByteData::GetDataSize(), lVar8 != 0x2157)) &&
     (lVar8 = cfd::core::ByteData::GetDataSize(), lVar8 != 0x2158)) {
    gtest_ar_._0_8_ = cfd::core::ByteData::GetDataSize();
    local_33e0[0].data_ = local_33e0[0].data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"tx.GetDataSize()","0",(unsigned_long *)&gtest_ar_,
               (int *)local_33e0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_33e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1a8,pcVar9);
      testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(local_33e0);
      if (gtest_ar_._0_8_ != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  iVar5 = cfd::core::ConfidentialTransaction::GetVsize();
  if (((iVar5 != 0x9f7) && (iVar5 = cfd::core::ConfidentialTransaction::GetVsize(), iVar5 != 0x9f8))
     && (iVar5 = cfd::core::ConfidentialTransaction::GetVsize(), iVar5 != 0x9f9)) {
    uVar6 = cfd::core::ConfidentialTransaction::GetVsize();
    gtest_ar_._0_4_ = uVar6;
    local_33e0[0].data_._0_4_ = 0x9f8;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar,"txc.GetVsize()","2552",(uint *)&gtest_ar_,(int *)local_33e0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_33e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1ac,pcVar9);
      testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(local_33e0);
      if (gtest_ar_._0_8_ != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  iVar5 = cfd::core::ConfidentialTransaction::GetVsize();
  minimum_fee = (uint)(iVar5 * 100) / 1000;
  gtest_ar_._0_4_ = 0xff;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"minimum_fee","255",&minimum_fee,(int *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_33e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1b0,pcVar9);
    testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(local_33e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar7 = cfd::core::Amount::GetSatoshiValue();
  if (uVar7 != ((ulong)_minimum_fee & 0xffffffff)) {
    uVar7 = cfd::core::Amount::GetSatoshiValue();
    if (uVar7 != minimum_fee + 1) {
      uVar7 = cfd::core::Amount::GetSatoshiValue();
      if (uVar7 != minimum_fee + 2) {
        gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue();
        testing::internal::CmpHelperEQ<long,unsigned_int>
                  ((internal *)&gtest_ar,"calc_fee.GetSatoshiValue()","minimum_fee",
                   (long *)&gtest_ar_,&minimum_fee);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (local_33e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x1b4,pcVar9);
          testing::internal::AssertHelper::operator=(local_33e0,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(local_33e0);
          if (gtest_ar_._0_8_ != 0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (gtest_ar_._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  if ((pointer)local_3398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3398._0_8_);
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&ct_addrs);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&utxos_and_options);
  cfd::core::Script::~Script(this_01);
  cfd::UtxoData::~UtxoData(&eutxo3.utxo);
  cfd::core::Script::~Script(this_00);
  cfd::UtxoData::~UtxoData(&eutxo2.utxo);
  cfd::core::Script::~Script(&eutxo1.claim_script);
  cfd::UtxoData::~UtxoData(&eutxo1.utxo);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&asset_address);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&address);
  cfd::UtxoData::~UtxoData(&utxo3);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  _factory = &PTR__AddressFactory_002dffd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (local_3288);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_LargeAmount_MinBits36)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{100000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{18000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{100000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxIn(OutPoint(utxo3.txid, utxo3.vout));
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ElementsUtxoAndOption eutxo1;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo3;
  eutxo1.utxo = utxo1;
  eutxo2.utxo = utxo2;
  eutxo3.utxo = utxo3;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1, eutxo2, eutxo3
  };

  // check estimateFee
  double effective_fee_rate = 0.1;
  uint64_t effective_fee_rate2 = 100;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate, 0, 36);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 256);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 225);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 32);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs, 1, 0, 36));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 8533) && (tx.GetDataSize() != 8534) &&
      (tx.GetDataSize() != 8535) && (tx.GetDataSize() != 8536)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 2551) && (txc.GetVsize() != 2552) && (txc.GetVsize() != 2553)) {
    EXPECT_EQ(txc.GetVsize(), 2552);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate2) / 1000;
  EXPECT_EQ(minimum_fee, 255);
  if ((calc_fee.GetSatoshiValue() != minimum_fee) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 1)) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 2))) {
    EXPECT_EQ(calc_fee.GetSatoshiValue(), minimum_fee);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}